

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageContentInsert(Fts5Storage *p,sqlite3_value **apVal,i64 *piRowid)

{
  uint uVar1;
  Fts5Config *pFVar2;
  Mem *pMem;
  sqlite3_mutex *psVar3;
  Vdbe *pVVar4;
  Vdbe *pStmt;
  int iVar5;
  i64 iVar6;
  sqlite3 *psVar7;
  long lVar8;
  Vdbe *p_1;
  sqlite3_stmt *pReplace;
  Vdbe *local_30;
  
  pFVar2 = p->pConfig;
  if (pFVar2->eContent == 0) {
    local_30 = (Vdbe *)0x0;
    iVar5 = fts5StorageGetStmt(p,3,(sqlite3_stmt **)&local_30,(char **)0x0);
    pVVar4 = local_30;
    if (iVar5 == 0) {
      lVar8 = 1;
      do {
        pStmt = local_30;
        if ((long)pFVar2->nCol + 1 < lVar8) {
          sqlite3_step((sqlite3_stmt *)local_30);
          iVar5 = sqlite3_reset((sqlite3_stmt *)pStmt);
          break;
        }
        iVar5 = sqlite3_bind_value((sqlite3_stmt *)pVVar4,(int)lVar8,apVal[lVar8]);
        lVar8 = lVar8 + 1;
      } while (iVar5 == 0);
    }
    psVar7 = pFVar2->db;
  }
  else {
    pMem = apVal[1];
    uVar1._0_2_ = pMem->flags;
    uVar1._2_1_ = pMem->enc;
    uVar1._3_1_ = pMem->eSubtype;
    if ((0x50505050UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      iVar6 = sqlite3VdbeIntValue(pMem);
      *piRowid = iVar6;
      return 0;
    }
    if (pFVar2->bColumnsize == 0) {
      return 0x14;
    }
    local_30 = (Vdbe *)0x0;
    iVar5 = fts5StorageGetStmt(p,6,(sqlite3_stmt **)&local_30,(char **)0x0);
    pVVar4 = local_30;
    if (iVar5 == 0) {
      iVar5 = vdbeUnbind(local_30,1);
      if ((iVar5 == 0) && (psVar3 = pVVar4->db->mutex, psVar3 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      iVar5 = vdbeUnbind(pVVar4,2);
      if ((iVar5 == 0) && (psVar3 = pVVar4->db->mutex, psVar3 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
      }
      sqlite3_step((sqlite3_stmt *)pVVar4);
      iVar5 = sqlite3_reset((sqlite3_stmt *)pVVar4);
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    psVar7 = p->pConfig->db;
    iVar5 = 0;
  }
  *piRowid = psVar7->lastRowid;
  return iVar5;
}

Assistant:

static int sqlite3Fts5StorageContentInsert(
  Fts5Storage *p, 
  sqlite3_value **apVal, 
  i64 *piRowid
){
  Fts5Config *pConfig = p->pConfig;
  int rc = SQLITE_OK;

  /* Insert the new row into the %_content table. */
  if( pConfig->eContent!=FTS5_CONTENT_NORMAL ){
    if( sqlite3_value_type(apVal[1])==SQLITE_INTEGER ){
      *piRowid = sqlite3_value_int64(apVal[1]);
    }else{
      rc = fts5StorageNewRowid(p, piRowid);
    }
  }else{
    sqlite3_stmt *pInsert = 0;    /* Statement to write %_content table */
    int i;                        /* Counter variable */
    rc = fts5StorageGetStmt(p, FTS5_STMT_INSERT_CONTENT, &pInsert, 0);
    for(i=1; rc==SQLITE_OK && i<=pConfig->nCol+1; i++){
      rc = sqlite3_bind_value(pInsert, i, apVal[i]);
    }
    if( rc==SQLITE_OK ){
      sqlite3_step(pInsert);
      rc = sqlite3_reset(pInsert);
    }
    *piRowid = sqlite3_last_insert_rowid(pConfig->db);
  }

  return rc;
}